

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.cxx
# Opt level: O3

bool cmConfigureFileCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *in_path;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  string *psVar7;
  iterator iVar8;
  long *plVar9;
  ostream *poVar10;
  size_type *psVar11;
  bool copyonly;
  uint uVar12;
  bool escapeQuotes;
  char *pcVar13;
  pointer pbVar14;
  ulong uVar15;
  iterator __end2;
  ulong uVar16;
  iterator __begin2;
  pointer arg;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  mode_t local_294;
  uint local_290;
  cmNewLineStyle newLineStyle;
  string outputFile;
  string errorMessage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidOptions;
  string unknown_args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filePermissionOptions;
  string e;
  ios_base local_178 [264];
  string inputFile;
  long *local_50 [2];
  long local_40 [2];
  
  in_path = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)in_path) < 0x21) {
    e._M_dataplus._M_p = (pointer)&e.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&e,"called with incorrect number of arguments, expected 2","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)e._M_dataplus._M_p != &e.field_2) {
      operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
  cmsys::SystemTools::CollapseFullPath(&inputFile,in_path,psVar7);
  bVar3 = cmsys::SystemTools::FileIsDirectory(&inputFile);
  if (bVar3) {
    e._M_dataplus._M_p = &DAT_00000011;
    e._M_string_length = (size_type)anon_var_dwarf_91ec17;
    e.field_2._M_allocated_capacity = 0;
    e.field_2._8_8_ = inputFile._M_string_length;
    views._M_len = 3;
    views._M_array = (iterator)&e;
    cmCatViews(&outputFile,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputFile._M_dataplus._M_p != &outputFile.field_2) {
      operator_delete(outputFile._M_dataplus._M_p,outputFile.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
    goto LAB_002a1b78;
  }
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(status->Makefile);
  cmsys::SystemTools::CollapseFullPath(&outputFile,pbVar14 + 1,psVar7);
  bVar3 = cmsys::SystemTools::FileIsDirectory(&outputFile);
  if (bVar3) {
    std::__cxx11::string::append((char *)&outputFile);
    cmsys::SystemTools::GetFilenameName(&e,in_path);
    std::__cxx11::string::_M_append((char *)&outputFile,(ulong)e._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)e._M_dataplus._M_p != &e.field_2) {
      operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = cmMakefile::CanIWriteThisFile(status->Makefile,&outputFile);
  if (bVar3) {
    errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
    errorMessage._M_string_length = 0;
    errorMessage.field_2._M_local_buf[0] = '\0';
    cmNewLineStyle::cmNewLineStyle(&newLineStyle);
    bVar3 = cmNewLineStyle::ReadFromArguments(&newLineStyle,args,&errorMessage);
    if (bVar3) {
      filePermissionOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      filePermissionOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      filePermissionOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((cmConfigureFileCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
           ::noopOptions == '\0') &&
         (iVar6 = __cxa_guard_acquire(&cmConfigureFileCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                       ::noopOptions), iVar6 != 0)) {
        e._M_dataplus._M_p = &DAT_00000009;
        e._M_string_length = (size_type)anon_var_dwarf_91ec85;
        e.field_2._M_allocated_capacity = 0xd;
        e.field_2._8_8_ =
             (long)"COPYONLY could not be used in combination with NEWLINE_STYLE" + 0x2f;
        __l._M_len = 7;
        __l._M_array = (iterator)&e;
        std::
        set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::set(&cmConfigureFileCommand::noopOptions,__l,
              (less<std::basic_string_view<char,_std::char_traits<char>_>_> *)&unknown_args,
              (allocator_type *)local_50);
        __cxa_atexit(std::
                     set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::~set,&cmConfigureFileCommand::noopOptions,&__dso_handle);
        __cxa_guard_release(&cmConfigureFileCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::noopOptions);
      }
      unknown_args._M_dataplus._M_p = (pointer)&unknown_args.field_2;
      unknown_args._M_string_length = 0;
      unknown_args.field_2._M_local_buf[0] = '\0';
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x41) {
        local_294 = 0;
        escapeQuotes = false;
        copyonly = false;
        bVar3 = false;
LAB_002a19e1:
        iVar6 = cmMakefile::ConfigureFile
                          (status->Makefile,&inputFile,&outputFile,copyonly,bVar3,escapeQuotes,
                           local_294,newLineStyle);
        bVar3 = true;
        if (iVar6 == 0) {
          e._M_dataplus._M_p = (pointer)&e.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&e,"Problem configuring file","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002a1af0:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)e._M_dataplus._M_p != &e.field_2) {
            operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002a1b0d;
        }
      }
      else {
        bVar3 = false;
        copyonly = false;
        escapeQuotes = false;
        bVar1 = false;
        bVar2 = false;
        local_290 = 0;
        iVar6 = 0;
        uVar15 = 2;
        uVar16 = 3;
        do {
          iVar5 = std::__cxx11::string::compare((char *)(pbVar14 + uVar15));
          if (iVar5 == 0) {
            bVar4 = cmNewLineStyle::IsValid(&newLineStyle);
            if (iVar6 == 1) {
              iVar6 = 2;
            }
            copyonly = true;
            if (bVar4) {
              e._M_dataplus._M_p = (pointer)&e.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&e,"COPYONLY could not be used in combination with NEWLINE_STYLE"
                         ,"");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002a1af0;
            }
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar15));
            if (iVar5 == 0) {
              if (iVar6 == 1) {
                iVar6 = 2;
              }
              escapeQuotes = true;
            }
            else {
              iVar5 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar15));
              if (iVar5 == 0) {
                if (iVar6 == 1) {
                  iVar6 = 2;
                }
                bVar3 = true;
              }
              else {
                iVar5 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar15));
                if (iVar5 == 0) {
                  bVar2 = true;
                  if (iVar6 == 1) {
                    e._M_dataplus._M_p = (pointer)&e.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&e,
                               " given both FILE_PERMISSIONS and NO_SOURCE_PERMISSIONS. Only one option allowed."
                               ,"");
                    std::__cxx11::string::_M_assign((string *)&status->Error);
                    goto LAB_002a1af0;
                  }
                }
                else {
                  iVar5 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar15));
                  if (iVar5 == 0) {
                    bVar1 = true;
                    if (iVar6 == 1) {
                      e._M_dataplus._M_p = (pointer)&e.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&e,
                                 " given both FILE_PERMISSIONS and USE_SOURCE_PERMISSIONS. Only one option allowed."
                                 ,"");
                      std::__cxx11::string::_M_assign((string *)&status->Error);
                      goto LAB_002a1af0;
                    }
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare
                                      ((char *)((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar15)
                                      );
                    if (iVar5 == 0) {
                      if (bVar1) {
                        e._M_dataplus._M_p = (pointer)&e.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&e,
                                   " given both FILE_PERMISSIONS and USE_SOURCE_PERMISSIONS. Only one option allowed."
                                   ,"");
                        std::__cxx11::string::_M_assign((string *)&status->Error);
                        goto LAB_002a1af0;
                      }
                      if (bVar2) {
                        e._M_dataplus._M_p = (pointer)&e.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&e,
                                   " given both FILE_PERMISSIONS and NO_SOURCE_PERMISSIONS. Only one option allowed."
                                   ,"");
                        std::__cxx11::string::_M_assign((string *)&status->Error);
                        goto LAB_002a1af0;
                      }
                      bVar4 = iVar6 == 0;
                      iVar6 = iVar6 + (uint)(iVar6 == 0);
                      local_290 = CONCAT31((int3)(local_290 >> 8),(byte)local_290 | bVar4);
                    }
                    else {
                      pbVar14 = (args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      e._M_string_length = (size_type)pbVar14[uVar15]._M_dataplus._M_p;
                      e._M_dataplus._M_p = (pointer)pbVar14[uVar15]._M_string_length;
                      iVar8 = std::
                              _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ::find(&cmConfigureFileCommand::noopOptions._M_t,(key_type *)&e);
                      if ((_Rb_tree_header *)iVar8._M_node ==
                          &cmConfigureFileCommand::noopOptions._M_t._M_impl.super__Rb_tree_header) {
                        if (iVar6 == 1) {
                          iVar6 = 1;
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(&filePermissionOptions,
                                      (args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar15);
                        }
                        else {
                          std::__cxx11::string::append((char *)&unknown_args);
                          std::__cxx11::string::_M_append
                                    ((char *)&unknown_args,
                                     (ulong)(args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start[uVar15].
                                            _M_dataplus._M_p);
                          std::__cxx11::string::append((char *)&unknown_args);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          pbVar14 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          bVar4 = uVar16 < (ulong)((long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14
                                  >> 5);
          uVar15 = uVar16;
          uVar16 = (ulong)((int)uVar16 + 1);
        } while (bVar4);
        if (unknown_args._M_string_length != 0) {
          cmStrCat<char_const(&)[49],std::__cxx11::string&>
                    (&e,(char (*) [49])"configure_file called with unknown argument(s):\n",
                     &unknown_args);
          cmMakefile::IssueMessage(status->Makefile,AUTHOR_WARNING,&e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)e._M_dataplus._M_p != &e.field_2) {
            operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
          }
          if (!(bool)(bVar1 & bVar2)) goto LAB_002a1bb2;
LAB_002a1ab5:
          e._M_dataplus._M_p = (pointer)&e.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&e,
                     " given both USE_SOURCE_PERMISSIONS and NO_SOURCE_PERMISSIONS. Only one option allowed."
                     ,"");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002a1af0;
        }
        if ((bool)(bVar1 & bVar2)) goto LAB_002a1ab5;
LAB_002a1bb2:
        pbVar14 = filePermissionOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_294 = 0;
        if ((local_290 & 1) == 0) {
LAB_002a1d6f:
          if ((bool)((bVar1 ^ 1U) & bVar2)) {
            local_294 = local_294 | 0x1a4;
          }
          goto LAB_002a19e1;
        }
        if (filePermissionOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            filePermissionOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          e._M_dataplus._M_p = (pointer)&e.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&e," given FILE_PERMISSIONS without any options.","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002a1af0;
        }
        invalidOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        invalidOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        invalidOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        arg = filePermissionOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar4 = cmFSPermissions::stringToModeT(arg,&local_294);
          if (!bVar4) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&invalidOptions,arg);
          }
          arg = arg + 1;
        } while (arg != pbVar14);
        if (invalidOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            invalidOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&invalidOptions);
          goto LAB_002a1d6f;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&e," given invalid permission ",0x1a);
        if (invalidOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            invalidOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar12 = 1;
          uVar15 = 0;
          do {
            pcVar13 = ",\"";
            if (uVar12 == 1) {
              pcVar13 = "\"";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&e,pcVar13,(ulong)(uVar12 != 1) + 1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&e,
                                 invalidOptions.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p,
                                 invalidOptions.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_string_length)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
            uVar15 = (ulong)uVar12;
            uVar12 = uVar12 + 1;
          } while (uVar15 < (ulong)((long)invalidOptions.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)invalidOptions.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&e,".",1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::ios_base::~ios_base(local_178);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&invalidOptions);
LAB_002a1b0d:
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)unknown_args._M_dataplus._M_p != &unknown_args.field_2) {
        operator_delete(unknown_args._M_dataplus._M_p,
                        CONCAT71(unknown_args.field_2._M_allocated_capacity._1_7_,
                                 unknown_args.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&filePermissionOptions);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&status->Error);
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)errorMessage._M_dataplus._M_p != &errorMessage.field_2) {
      operator_delete(errorMessage._M_dataplus._M_p,
                      CONCAT71(errorMessage.field_2._M_allocated_capacity._1_7_,
                               errorMessage.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::operator+(&errorMessage,"attempted to configure a file: ",&outputFile);
    plVar9 = (long *)std::__cxx11::string::append((char *)&errorMessage);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar11) {
      e.field_2._M_allocated_capacity = *psVar11;
      e.field_2._8_8_ = plVar9[3];
      e._M_dataplus._M_p = (pointer)&e.field_2;
    }
    else {
      e.field_2._M_allocated_capacity = *psVar11;
      e._M_dataplus._M_p = (pointer)*plVar9;
    }
    e._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)errorMessage._M_dataplus._M_p != &errorMessage.field_2) {
      operator_delete(errorMessage._M_dataplus._M_p,
                      CONCAT71(errorMessage.field_2._M_allocated_capacity._1_7_,
                               errorMessage.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::_M_assign((string *)&status->Error);
    cmSystemTools::s_FatalErrorOccurred = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)e._M_dataplus._M_p != &e.field_2) {
      operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputFile._M_dataplus._M_p != &outputFile.field_2) {
    operator_delete(outputFile._M_dataplus._M_p,outputFile.field_2._M_allocated_capacity + 1);
  }
LAB_002a1b78:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)inputFile._M_dataplus._M_p != &inputFile.field_2) {
    operator_delete(inputFile._M_dataplus._M_p,inputFile.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmConfigureFileCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments, expected 2");
    return false;
  }

  std::string const& inFile = args[0];
  const std::string inputFile = cmSystemTools::CollapseFullPath(
    inFile, status.GetMakefile().GetCurrentSourceDirectory());

  // If the input location is a directory, error out.
  if (cmSystemTools::FileIsDirectory(inputFile)) {
    status.SetError(cmStrCat("input location\n  ", inputFile,
                             "\n"
                             "is a directory but a file was expected."));
    return false;
  }

  std::string const& outFile = args[1];
  std::string outputFile = cmSystemTools::CollapseFullPath(
    outFile, status.GetMakefile().GetCurrentBinaryDirectory());

  // If the output location is already a directory put the file in it.
  if (cmSystemTools::FileIsDirectory(outputFile)) {
    outputFile += "/";
    outputFile += cmSystemTools::GetFilenameName(inFile);
  }

  if (!status.GetMakefile().CanIWriteThisFile(outputFile)) {
    std::string e = "attempted to configure a file: " + outputFile +
      " into a source directory.";
    status.SetError(e);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  std::string errorMessage;
  cmNewLineStyle newLineStyle;
  if (!newLineStyle.ReadFromArguments(args, errorMessage)) {
    status.SetError(errorMessage);
    return false;
  }
  bool copyOnly = false;
  bool escapeQuotes = false;
  bool useSourcePermissions = false;
  bool noSourcePermissions = false;
  bool filePermissions = false;
  std::vector<std::string> filePermissionOptions;

  enum class Doing
  {
    DoingNone,
    DoingFilePermissions,
    DoneFilePermissions
  };

  Doing doing = Doing::DoingNone;

  static std::set<cm::string_view> noopOptions = {
    /* Legacy.  */
    "IMMEDIATE"_s,
    /* Handled by NewLineStyle member.  */
    "NEWLINE_STYLE"_s,
    "LF"_s,
    "UNIX"_s,
    "CRLF"_s,
    "WIN32"_s,
    "DOS"_s,
  };

  std::string unknown_args;
  bool atOnly = false;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "COPYONLY") {
      if (doing == Doing::DoingFilePermissions) {
        doing = Doing::DoneFilePermissions;
      }
      copyOnly = true;
      if (newLineStyle.IsValid()) {
        status.SetError("COPYONLY could not be used in combination "
                        "with NEWLINE_STYLE");
        return false;
      }
    } else if (args[i] == "ESCAPE_QUOTES") {
      if (doing == Doing::DoingFilePermissions) {
        doing = Doing::DoneFilePermissions;
      }
      escapeQuotes = true;
    } else if (args[i] == "@ONLY") {
      if (doing == Doing::DoingFilePermissions) {
        doing = Doing::DoneFilePermissions;
      }
      atOnly = true;
    } else if (args[i] == "NO_SOURCE_PERMISSIONS") {
      if (doing == Doing::DoingFilePermissions) {
        status.SetError(" given both FILE_PERMISSIONS and "
                        "NO_SOURCE_PERMISSIONS. Only one option allowed.");
        return false;
      }
      noSourcePermissions = true;
    } else if (args[i] == "USE_SOURCE_PERMISSIONS") {
      if (doing == Doing::DoingFilePermissions) {
        status.SetError(" given both FILE_PERMISSIONS and "
                        "USE_SOURCE_PERMISSIONS. Only one option allowed.");
        return false;
      }
      useSourcePermissions = true;
    } else if (args[i] == "FILE_PERMISSIONS") {
      if (useSourcePermissions) {
        status.SetError(" given both FILE_PERMISSIONS and "
                        "USE_SOURCE_PERMISSIONS. Only one option allowed.");
        return false;
      }
      if (noSourcePermissions) {
        status.SetError(" given both FILE_PERMISSIONS and "
                        "NO_SOURCE_PERMISSIONS. Only one option allowed.");
        return false;
      }

      if (doing == Doing::DoingNone) {
        doing = Doing::DoingFilePermissions;
        filePermissions = true;
      }
    } else if (noopOptions.find(args[i]) != noopOptions.end()) {
      /* Ignore no-op options.  */
    } else if (doing == Doing::DoingFilePermissions) {
      filePermissionOptions.push_back(args[i]);
    } else {
      unknown_args += " ";
      unknown_args += args[i];
      unknown_args += "\n";
    }
  }
  if (!unknown_args.empty()) {
    std::string msg = cmStrCat(
      "configure_file called with unknown argument(s):\n", unknown_args);
    status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, msg);
  }

  if (useSourcePermissions && noSourcePermissions) {
    status.SetError(" given both USE_SOURCE_PERMISSIONS and "
                    "NO_SOURCE_PERMISSIONS. Only one option allowed.");
    return false;
  }

  mode_t permissions = 0;

  if (filePermissions) {
    if (filePermissionOptions.empty()) {
      status.SetError(" given FILE_PERMISSIONS without any options.");
      return false;
    }

    std::vector<std::string> invalidOptions;
    for (auto const& e : filePermissionOptions) {
      if (!cmFSPermissions::stringToModeT(e, permissions)) {
        invalidOptions.push_back(e);
      }
    }

    if (!invalidOptions.empty()) {
      std::ostringstream oss;
      oss << " given invalid permission ";
      for (auto i = 0u; i < invalidOptions.size(); i++) {
        if (i == 0u) {
          oss << "\"" << invalidOptions[i] << "\"";
        } else {
          oss << ",\"" << invalidOptions[i] << "\"";
        }
      }
      oss << ".";
      status.SetError(oss.str());
      return false;
    }
  }

  if (noSourcePermissions) {
    permissions |= cmFSPermissions::mode_owner_read;
    permissions |= cmFSPermissions::mode_owner_write;
    permissions |= cmFSPermissions::mode_group_read;
    permissions |= cmFSPermissions::mode_world_read;
  }

  if (!status.GetMakefile().ConfigureFile(inputFile, outputFile, copyOnly,
                                          atOnly, escapeQuotes, permissions,
                                          newLineStyle)) {
    status.SetError("Problem configuring file");
    return false;
  }

  return true;
}